

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void test_iterator_generate_data(uint32_t **values_out,uint32_t *count_out)

{
  uint uVar1;
  undefined4 *puVar2;
  int *in_RSI;
  undefined8 *in_RDI;
  int i_8;
  uint32_t i_7;
  uint32_t i_6;
  uint32_t i_5;
  uint32_t run_index;
  uint32_t i_4;
  uint32_t i_3;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  uint32_t base;
  uint32_t count;
  uint32_t *values;
  size_t capacity;
  int in_stack_ffffffffffffffac;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_24;
  
  puVar2 = (undefined4 *)malloc(4000000);
  *puVar2 = 0;
  puVar2[1] = 0x4d20000;
  puVar2[2] = 0x4d4ffff;
  local_24 = 3;
  for (local_2c = 0; local_2c < 0x10000; local_2c = local_2c + 1) {
    puVar2[local_24] = local_2c + 0x4d60000;
    local_24 = local_24 + 1;
  }
  for (local_30 = 0; local_30 < 0x10000; local_30 = local_30 + 2) {
    puVar2[local_24] = local_30 + 0x4d80000;
    local_24 = local_24 + 1;
  }
  for (local_34 = 1; local_34 < 0x10000; local_34 = local_34 + 2) {
    puVar2[local_24] = local_34 + 0x4da0000;
    local_24 = local_24 + 1;
  }
  for (local_38 = 0; local_38 < 0x10000; local_38 = local_38 + 0x41) {
    puVar2[local_24] = local_38 + 0x4dc0000;
    local_24 = local_24 + 1;
  }
  iVar7 = 0;
  for (uVar8 = 0; uVar8 < 0x10000; uVar8 = uVar8 + 1) {
    if (uVar8 == ((uint)((iVar7 + 1) * (iVar7 + 2)) >> 1) - 1) {
      iVar7 = iVar7 + 1;
    }
    else {
      puVar2[local_24] = uVar8 + 0x4de0000;
      local_24 = local_24 + 1;
    }
  }
  for (uVar6 = 0xff9c; uVar6 < 0x10000; uVar6 = uVar6 + 1) {
    puVar2[local_24] = uVar6 + 0x4e00000;
    local_24 = local_24 + 1;
  }
  for (uVar5 = 0; uVar5 < 0x10000; uVar5 = uVar5 + 1) {
    puVar2[local_24] = uVar5 + 0x4e10000;
    local_24 = local_24 + 1;
  }
  for (uVar4 = 0; uVar4 < 100; uVar4 = uVar4 + 1) {
    puVar2[local_24] = uVar4 + 0x4e20000;
    local_24 = local_24 + 1;
  }
  for (iVar3 = 0; iVar3 < 0x10000; iVar3 = uVar1 % 10 + 1 + iVar3) {
    puVar2[local_24] = iVar3 + 0x4e40000;
    uVar1 = our_rand();
    local_24 = local_24 + 1;
  }
  puVar2[local_24] = 0xffffffff;
  _assert_true(CONCAT44(uVar8,iVar7),(char *)CONCAT44(uVar6,uVar5),(char *)CONCAT44(uVar4,iVar3),
               in_stack_ffffffffffffffac);
  *in_RDI = puVar2;
  *in_RSI = local_24 + 1;
  return;
}

Assistant:

void test_iterator_generate_data(uint32_t **values_out, uint32_t *count_out) {
    const size_t capacity = 1000 * 1000;
    uint32_t *values =
        (uint32_t *)malloc(sizeof(uint32_t) * capacity);  // ascending order
    uint32_t count = 0;
    uint32_t base = 1234;  // container index

    // min allowed value
    values[count++] = 0;

    // only the very first value in container is set
    values[count++] = base * 65536;
    base += 2;

    // only the very last value in container is set
    values[count++] = base * 65536 + 65535;
    base += 2;

    // fully filled container
    for (uint32_t i = 0; i < 65536; i++) {
        values[count++] = base * 65536 + i;
    }
    base += 2;

    // even values
    for (uint32_t i = 0; i < 65536; i += 2) {
        values[count++] = base * 65536 + i;
    }
    base += 2;

    // odd values
    for (uint32_t i = 1; i < 65536; i += 2) {
        values[count++] = base * 65536 + i;
    }
    base += 2;

    // each next 64-bit word is ROR'd by one
    for (uint32_t i = 0; i < 65536; i += 65) {
        values[count++] = base * 65536 + i;
    }
    base += 2;

    // runs of increasing length: 0, 1,0, 1,1,0, 1,1,1,0, ...
    for (uint32_t i = 0, run_index = 0; i < 65536; i++) {
        if (i != (run_index + 1) * (run_index + 2) / 2 - 1) {
            values[count++] = base * 65536 + i;
        } else {
            run_index++;
        }
    }
    base += 2;

    // 00000XX, XXXXXX, XX0000
    for (uint32_t i = 65536 - 100; i < 65536; i++) {
        values[count++] = base * 65536 + i;
    }
    base += 1;
    for (uint32_t i = 0; i < 65536; i++) {
        values[count++] = base * 65536 + i;
    }
    base += 1;
    for (uint32_t i = 0; i < 100; i++) {
        values[count++] = base * 65536 + i;
    }
    base += 2;

    // random
    for (int i = 0; i < 65536; i += our_rand() % 10 + 1) {
        values[count++] = base * 65536 + i;
    }
    base += 2;

    // max allowed value
    values[count++] = UINT32_MAX;

    assert_true(count <= capacity);
    *values_out = values;
    *count_out = count;
}